

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::setBitsSlowCase(APInt *this,uint loBit,uint hiBit)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint local_3c;
  uint word;
  uint64_t hiMask;
  ulong uStack_28;
  uint hiShiftAmt;
  uint64_t loMask;
  uint hiWord;
  uint loWord;
  uint hiBit_local;
  uint loBit_local;
  APInt *this_local;
  
  local_3c = whichWord(loBit);
  uVar1 = whichWord(hiBit);
  uVar2 = whichBit(loBit);
  uStack_28 = -1L << ((byte)uVar2 & 0x3f);
  uVar2 = whichBit(hiBit);
  if (uVar2 != 0) {
    uVar3 = 0xffffffffffffffff >> (0x40U - (char)uVar2 & 0x3f);
    if (uVar1 == local_3c) {
      uStack_28 = uVar3 & uStack_28;
    }
    else {
      (this->U).pVal[uVar1] = uVar3 | (this->U).pVal[uVar1];
    }
  }
  (this->U).pVal[local_3c] = uStack_28 | (this->U).pVal[local_3c];
  while (local_3c = local_3c + 1, local_3c < uVar1) {
    (this->U).pVal[local_3c] = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void APInt::setBitsSlowCase(unsigned loBit, unsigned hiBit) {
  unsigned loWord = whichWord(loBit);
  unsigned hiWord = whichWord(hiBit);

  // Create an initial mask for the low word with zeros below loBit.
  uint64_t loMask = WORD_MAX << whichBit(loBit);

  // If hiBit is not aligned, we need a high mask.
  unsigned hiShiftAmt = whichBit(hiBit);
  if (hiShiftAmt != 0) {
    // Create a high mask with zeros above hiBit.
    uint64_t hiMask = WORD_MAX >> (APINT_BITS_PER_WORD - hiShiftAmt);
    // If loWord and hiWord are equal, then we combine the masks. Otherwise,
    // set the bits in hiWord.
    if (hiWord == loWord)
      loMask &= hiMask;
    else
      U.pVal[hiWord] |= hiMask;
  }
  // Apply the mask to the low word.
  U.pVal[loWord] |= loMask;

  // Fill any words between loWord and hiWord with all ones.
  for (unsigned word = loWord + 1; word < hiWord; ++word)
    U.pVal[word] = WORD_MAX;
}